

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void check_match(LexState *ls,int what,int who,int where)

{
  lua_State *L;
  char *pcVar1;
  char *pcVar2;
  
  if ((ls->t).token == what) {
    luaX_next(ls);
    return;
  }
  if (ls->linenumber == where) {
    error_expected(ls,what);
  }
  L = ls->L;
  pcVar1 = luaX_token2str(ls,what);
  pcVar2 = luaX_token2str(ls,who);
  pcVar1 = luaO_pushfstring(L,"%s expected (to close %s at line %d)",pcVar1,pcVar2,
                            (ulong)(uint)where);
  luaX_syntaxerror(ls,pcVar1);
}

Assistant:

static void check_match (LexState *ls, int what, int who, int where) {
  if (!testnext(ls, what)) {
    if (where == ls->linenumber)
      error_expected(ls, what);
    else {
      luaX_syntaxerror(ls, luaO_pushfstring(ls->L,
             "%s expected (to close %s at line %d)",
              luaX_token2str(ls, what), luaX_token2str(ls, who), where));
    }
  }
}